

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O0

int __thiscall ncnn::Convolution::load_model(Convolution *this,ModelBin *mb)

{
  long *plVar1;
  bool bVar2;
  float *pfVar3;
  Option *pOVar4;
  Layer *pLVar5;
  undefined8 *in_RSI;
  long in_RDI;
  Mat weights [1];
  ParamDict pd_2;
  float top_rescale;
  ParamDict pd_1;
  Mat int8_weight_data;
  ParamDict pd;
  Layer *op;
  bool weight_data_is_float32;
  bool weight_data_is_int8;
  undefined4 in_stack_ffffffffffffee48;
  int in_stack_ffffffffffffee4c;
  Mat *in_stack_ffffffffffffee50;
  Mat *in_stack_ffffffffffffee58;
  ParamDict *in_stack_ffffffffffffee60;
  ParamDict *local_1180;
  ParamDict *in_stack_ffffffffffffeea0;
  ParamDict *pPVar6;
  Mat *local_1158;
  undefined1 local_10d8 [16];
  Mat local_10c8;
  ParamDict local_1090;
  float local_b7c;
  ParamDict local_b78;
  uint local_664;
  Mat local_660;
  ParamDict local_628;
  Layer *local_118;
  undefined1 local_10a;
  undefined1 local_109;
  Mat local_108;
  Mat local_d0;
  undefined1 local_98 [72];
  undefined1 local_50 [56];
  undefined8 *local_18;
  int local_4;
  
  local_18 = in_RSI;
  (**(code **)*in_RSI)(local_50,in_RSI,*(undefined4 *)(in_RDI + 0xa8),0);
  Mat::operator=(in_stack_ffffffffffffee58,in_stack_ffffffffffffee50);
  Mat::~Mat((Mat *)0x15ff2a);
  bVar2 = Mat::empty(in_stack_ffffffffffffee50);
  if (bVar2) {
    local_4 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xa4) != 0) {
      (**(code **)*local_18)(local_98,local_18,*(undefined4 *)(in_RDI + 0x80),1);
      Mat::operator=(in_stack_ffffffffffffee58,in_stack_ffffffffffffee50);
      Mat::~Mat((Mat *)0x15ffed);
      bVar2 = Mat::empty(in_stack_ffffffffffffee50);
      if (bVar2) {
        return -100;
      }
    }
    if (*(int *)(in_RDI + 0xac) != 0) {
      (**(code **)*local_18)(&local_d0,local_18,1);
      pfVar3 = Mat::operator[](&local_d0,0);
      *(float *)(in_RDI + 0x120) = *pfVar3;
      Mat::~Mat((Mat *)0x1600bd);
      (**(code **)*local_18)(&local_108,local_18,1);
      pfVar3 = Mat::operator[](&local_108,0);
      *(float *)(in_RDI + 0x124) = *pfVar3;
      Mat::~Mat((Mat *)0x160126);
    }
    local_109 = *(long *)(in_RDI + 0xc0) == 1;
    local_10a = *(long *)(in_RDI + 0xc0) == 4;
    if (((bool)local_109) && ((*(byte *)(in_RDI + 0x128) & 1) == 0)) {
      fprintf(_stderr,"quantized int8 weight loaded but use_int8_inference disabled\n");
      local_4 = -1;
    }
    else {
      if (((bool)local_10a) && ((*(byte *)(in_RDI + 0x128) & 1) != 0)) {
        local_118 = create_layer(in_stack_ffffffffffffee4c);
        ParamDict::ParamDict(in_stack_ffffffffffffeea0);
        ParamDict::set(&local_628,0,*(float *)(in_RDI + 0x120));
        (*local_118->_vptr_Layer[2])(local_118,&local_628);
        Mat::Mat(&local_660);
        pLVar5 = local_118;
        pOVar4 = get_default_option();
        (*pLVar5->_vptr_Layer[5])(pLVar5,in_RDI + 0xb0,&local_660,pOVar4);
        if (local_118 != (Layer *)0x0) {
          (*local_118->_vptr_Layer[1])();
        }
        bVar2 = Mat::empty(in_stack_ffffffffffffee50);
        if (bVar2) {
          local_4 = -100;
        }
        else {
          Mat::operator=(in_stack_ffffffffffffee58,in_stack_ffffffffffffee50);
        }
        local_664 = (uint)bVar2;
        Mat::~Mat((Mat *)0x1603a5);
        ParamDict::~ParamDict(in_stack_ffffffffffffee60);
        if (local_664 != 0) {
          return local_4;
        }
      }
      if ((*(byte *)(in_RDI + 0x128) & 1) != 0) {
        pLVar5 = create_layer(in_stack_ffffffffffffee4c);
        *(Layer **)(in_RDI + 0x130) = pLVar5;
        ParamDict::ParamDict(in_stack_ffffffffffffeea0);
        ParamDict::set(&local_b78,0,*(float *)(in_RDI + 0x124));
        (**(code **)(**(long **)(in_RDI + 0x130) + 0x10))();
        ParamDict::~ParamDict(in_stack_ffffffffffffee60);
        pLVar5 = create_layer(in_stack_ffffffffffffee4c);
        *(Layer **)(in_RDI + 0x138) = pLVar5;
        local_b7c = 1.0 / (*(float *)(in_RDI + 0x124) * *(float *)(in_RDI + 0x120));
        ParamDict::ParamDict(in_stack_ffffffffffffeea0);
        ParamDict::set(&local_1090,0,local_b7c);
        ParamDict::set(&local_1090,1,*(int *)(in_RDI + 0xa4));
        ParamDict::set(&local_1090,2,*(int *)(in_RDI + 0x80));
        (**(code **)(**(long **)(in_RDI + 0x138) + 0x10))(*(long **)(in_RDI + 0x138),&local_1090);
        local_1158 = &local_10c8;
        pPVar6 = &local_1090;
        do {
          Mat::Mat(local_1158);
          local_1158 = local_1158 + 1;
        } while ((ParamDict *)local_1158 != pPVar6);
        Mat::operator=(in_stack_ffffffffffffee58,in_stack_ffffffffffffee50);
        plVar1 = *(long **)(in_RDI + 0x138);
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)in_stack_ffffffffffffee50,
                   (Mat *)CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48));
        (**(code **)(*plVar1 + 0x18))(plVar1,local_10d8);
        local_1180 = &local_1090;
        do {
          local_1180 = (ParamDict *)&local_1180[-1].params[0x13].v;
          Mat::~Mat((Mat *)0x16060d);
        } while (local_1180 != (ParamDict *)&local_10c8);
        ParamDict::~ParamDict(in_stack_ffffffffffffee60);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Convolution::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    if (int8_scale_term)
    {
        weight_data_int8_scale = mb.load(1, 1)[0];
        bottom_blob_int8_scale = mb.load(1, 1)[0];
    }

    bool weight_data_is_int8 = (weight_data.elemsize == (size_t)1u);
    bool weight_data_is_float32 = (weight_data.elemsize == (size_t)4u);

    if (weight_data_is_int8 && !use_int8_inference)
    {
        fprintf(stderr, "quantized int8 weight loaded but use_int8_inference disabled\n");
        return -1;
    }

    if (weight_data_is_float32 && use_int8_inference)
    {
        // quantize weight to int8
        Layer* op = ncnn::create_layer(ncnn::LayerType::Quantize);

        ncnn::ParamDict pd;
        pd.set(0, weight_data_int8_scale);// scale

        op->load_param(pd);

        Mat int8_weight_data;
        op->forward(weight_data, int8_weight_data);

        delete op;

        if (int8_weight_data.empty())
            return -100;

        weight_data = int8_weight_data;
    }

    if (use_int8_inference)
    {
        quantize = ncnn::create_layer(ncnn::LayerType::Quantize);
        {
            ncnn::ParamDict pd;
            pd.set(0, bottom_blob_int8_scale);// scale

            quantize->load_param(pd);
        }

        dequantize = ncnn::create_layer(ncnn::LayerType::Dequantize);
        {
            float top_rescale = 1.f / (bottom_blob_int8_scale * weight_data_int8_scale);

            ncnn::ParamDict pd;
            pd.set(0, top_rescale);// scale
            pd.set(1, bias_term);// bias_term
            pd.set(2, num_output);// bias_data_size

            dequantize->load_param(pd);

            ncnn::Mat weights[1];
            weights[0] = bias_data;

            dequantize->load_model(ModelBinFromMatArray(weights));
        }
    }

    return 0;
}